

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_modify_passwords_file(char *fname,char *domain,char *user,char *pass)

{
  int iVar1;
  char ha1buf [33];
  char local_48 [40];
  
  iVar1 = 0;
  if (user != (char *)0x0 && (domain != (char *)0x0 && fname != (char *)0x0)) {
    if ((pass == (char *)0x0) || (*pass == '\0')) {
      iVar1 = mg_modify_passwords_file_ha1(fname,domain,user,(char *)0x0);
      return iVar1;
    }
    mg_md5(local_48,user,":",domain,":",pass,0);
    iVar1 = mg_modify_passwords_file_ha1(fname,domain,user,local_48);
  }
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file(const char *fname,
                         const char *domain,
                         const char *user,
                         const char *pass)
{
	char ha1buf[33];
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}
	if ((pass == NULL) || (pass[0] == 0)) {
		return mg_modify_passwords_file_ha1(fname, domain, user, NULL);
	}

	mg_md5(ha1buf, user, ":", domain, ":", pass, NULL);
	return mg_modify_passwords_file_ha1(fname, domain, user, ha1buf);
}